

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O3

size_t __thiscall
cappuccino::utlru_cache<std::__cxx11::string,unsigned_long,(cappuccino::thread_safe)0>::
insert_range<std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>
          (utlru_cache<std::__cxx11::string,unsigned_long,(cappuccino::thread_safe)0> *this,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *key_value_range,allow a)

{
  pointer ppVar1;
  long lVar2;
  bool bVar3;
  time_point now;
  type *key;
  pointer key_00;
  size_t sVar4;
  lock_guard<cappuccino::mutex<(cappuccino::thread_safe)0,_std::mutex>_> guard;
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  key_00 = (key_value_range->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (key_value_range->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (key_00 == ppVar1) {
    sVar4 = 0;
  }
  else {
    lVar2 = *(long *)(this + 0x28);
    sVar4 = 0;
    do {
      bVar3 = utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)0>
              ::do_insert_update((utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)0>
                                  *)this,&key_00->first,&key_00->second,now,
                                 (time_point)(lVar2 * 1000000 + (long)now.__d.__r),a);
      sVar4 = sVar4 + bVar3;
      key_00 = key_00 + 1;
    } while (key_00 != ppVar1);
  }
  return sVar4;
}

Assistant:

auto insert_range(range_type&& key_value_range, allow a = allow::insert_or_update) -> size_t
    {
        auto   now         = std::chrono::steady_clock::now();
        auto   expire_time = now + m_ttl;
        size_t inserted{0};

        {
            std::lock_guard guard{m_lock};
            for (auto& [key, value] : key_value_range)
            {
                if (do_insert_update(key, std::move(value), now, expire_time, a))
                {
                    ++inserted;
                }
            }
        }

        return inserted;
    }